

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherical_micro_batcher.hpp
# Opt level: O2

value_type * __thiscall
IntegratorXX::
SphericalMicroBatcher<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
::const_iterator::operator*(value_type *__return_storage_ptr__,const_iterator *this)

{
  unsigned_long *puVar1;
  array<double,_3UL> *paVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  __normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  p_batch_end;
  __normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  __first;
  __normal_iterator<const_std::array<double,_3UL>_*,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  p_batch_begin;
  allocator_type local_8a;
  allocator_type local_89;
  _Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> local_88;
  _Vector_base<double,_std::allocator<double>_> local_70;
  tuple<std::array<double,_3UL>,_std::array<double,_3UL>_> local_58;
  
  puVar1 = (this->idx_it)._M_current;
  paVar2 = (this->point_begin)._M_current;
  uVar3 = *puVar1;
  uVar4 = puVar1[1];
  __first._M_current = paVar2 + uVar3;
  p_batch_begin._M_current = paVar2 + uVar4;
  p_batch_end._M_current = (array<double,_3UL> *)(this->weight_begin)._M_current;
  detail::
  get_box_bounds_points<__gnu_cxx::__normal_iterator<std::array<double,3ul>const*,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>>
            (&local_58,(detail *)__first._M_current,p_batch_begin,p_batch_end);
  std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>::
  vector<__gnu_cxx::__normal_iterator<std::array<double,3ul>const*,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>,void>
            ((vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>> *)&local_88,
             __first,p_batch_begin,&local_89);
  std::vector<double,std::allocator<double>>::
  vector<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,void>
            ((vector<double,std::allocator<double>> *)&local_70,
             (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
             ((p_batch_end._M_current)->_M_elems + uVar3),
             (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
             ((p_batch_end._M_current)->_M_elems + uVar4),&local_8a);
  std::
  tuple<std::array<double,_3UL>,_std::array<double,_3UL>,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  ::
  tuple<std::array<double,_3UL>_&,_std::array<double,_3UL>_&,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>,_true,_true>
            (__return_storage_ptr__,
             &local_58.super__Tuple_impl<0UL,_std::array<double,_3UL>,_std::array<double,_3UL>_>.
              super__Head_base<0UL,_std::array<double,_3UL>,_false>._M_head_impl,
             (array<double,_3UL> *)&local_58,
             (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)&local_88
             ,(vector<double,_std::allocator<double>_> *)&local_70);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_70);
  std::_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
  ~_Vector_base(&local_88);
  return __return_storage_ptr__;
}

Assistant:

value_type operator*() {

      auto [npts,pb,pe,wb,we] = range();
      auto [box_lo, box_up]   = detail::get_box_bounds_points(pb, pe);

      return std::make_tuple(
        box_lo,
        box_up,
        std::vector<point_type>( pb, pe ),
        std::vector<weight_type>( wb, we )
      );

    }